

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O3

char * gdImageStringFTCircle
                 (gdImagePtr im,int cx,int cy,double radius,double textRadius,double fillPortion,
                 char *font,double points,char *top,char *bottom,int fgcolor)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  gdImagePtr im_00;
  gdImagePtr dst;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  double dVar17;
  char *local_c0;
  int brect [8];
  
  dVar17 = points * 4.0;
  local_c0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar17,0.0,0,0,bottom);
  iVar11 = brect[7];
  iVar4 = brect[5];
  iVar9 = brect[3];
  iVar16 = brect[1];
  if (local_c0 == (char *)0x0) {
    iVar8 = brect[6];
    if (brect[6] < brect[4]) {
      iVar8 = brect[4];
    }
    iVar7 = brect[6];
    if (brect[4] < brect[6]) {
      iVar7 = brect[4];
    }
    iVar14 = brect[2];
    if (brect[2] < brect[0]) {
      iVar14 = brect[0];
    }
    iVar1 = brect[2];
    if (brect[0] < brect[2]) {
      iVar1 = brect[0];
    }
    if (iVar14 <= iVar8) {
      iVar14 = iVar8;
    }
    if (iVar7 <= iVar1) {
      iVar1 = iVar7;
    }
    local_c0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar17,0.0,0,0,top);
    if (local_c0 == (char *)0x0) {
      uVar6 = iVar14 - iVar1;
      iVar8 = iVar11;
      if (iVar11 < iVar4) {
        iVar8 = iVar4;
      }
      if (iVar4 < iVar11) {
        iVar11 = iVar4;
      }
      iVar4 = iVar9;
      if (iVar9 < iVar16) {
        iVar4 = iVar16;
      }
      if (iVar16 < iVar9) {
        iVar9 = iVar16;
      }
      if (iVar4 <= iVar8) {
        iVar4 = iVar8;
      }
      if (iVar11 <= iVar9) {
        iVar9 = iVar11;
      }
      iVar11 = brect[6];
      if (brect[6] < brect[4]) {
        iVar11 = brect[4];
      }
      if (brect[4] < brect[6]) {
        brect[6] = brect[4];
      }
      iVar16 = brect[2];
      if (brect[2] < brect[0]) {
        iVar16 = brect[0];
      }
      if (brect[0] < brect[2]) {
        brect[2] = brect[0];
      }
      if (iVar16 <= iVar11) {
        iVar16 = iVar11;
      }
      if (brect[6] <= brect[2]) {
        brect[2] = brect[6];
      }
      uVar15 = iVar16 - brect[2];
      iVar11 = brect[7];
      if (brect[7] < brect[5]) {
        iVar11 = brect[5];
      }
      if (brect[5] < brect[7]) {
        brect[7] = brect[5];
      }
      iVar16 = brect[3];
      if (brect[3] < brect[1]) {
        iVar16 = brect[1];
      }
      if (brect[1] < brect[3]) {
        brect[3] = brect[1];
      }
      if (iVar16 <= iVar11) {
        iVar16 = iVar11;
      }
      if (brect[7] <= brect[3]) {
        brect[3] = brect[7];
      }
      iVar11 = uVar15 + 6;
      if ((int)uVar15 < (int)uVar6) {
        iVar11 = uVar6 + 6;
      }
      iVar8 = iVar11 * 2 + 4;
      uVar5 = iVar16 - brect[3];
      if (iVar16 - brect[3] < iVar4 - iVar9) {
        uVar5 = iVar4 - iVar9;
      }
      iVar9 = uVar5 + 6;
      im_00 = gdImageCreateTrueColor(iVar8,iVar9);
      if (im_00 == (gdImagePtr)0x0) {
        local_c0 = "could not create first image";
      }
      else {
        iVar16 = iVar8 >> 1;
        local_c0 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar17,0.0,
                                   (int)(iVar16 - (uVar6 + 6)) / 2,(int)dVar17,bottom);
        if ((local_c0 == (char *)0x0) &&
           (local_c0 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar17,0.0,
                                       (int)(iVar16 - (uVar15 + 6)) / 2 + iVar16,(int)dVar17,top),
           local_c0 == (char *)0x0)) {
          iVar4 = iVar11 * 2;
          if ((uVar5 & 1) == 0) {
            if (0 < iVar9 >> 1) {
              if ((int)uVar6 < (int)uVar15) {
                uVar6 = uVar15;
              }
              uVar10 = 0;
              do {
                if (iVar16 < iVar4) {
                  piVar2 = im_00->tpixels[(int)(~(uint)uVar10 + iVar9)];
                  piVar3 = im_00->tpixels[uVar10];
                  lVar12 = ((long)((ulong)(uVar6 + 8) << 0x21) >> 0x21) + 1;
                  iVar11 = ((iVar16 + uVar6 * 2) - ((int)(uVar6 * 2 + 0x10) >> 1)) + 0xe;
                  do {
                    iVar7 = piVar2[(long)iVar11 + -1];
                    piVar2[(long)iVar11 + -1] = piVar3[lVar12 + 1];
                    piVar3[lVar12 + 1] = iVar7;
                    lVar12 = lVar12 + 1;
                    iVar11 = iVar11 + -1;
                  } while (lVar12 <= iVar4);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != (uint)(iVar9 >> 1));
            }
          }
          else if (-8 < (int)uVar5) {
            iVar11 = iVar11 * 2 + 7;
            if (-1 < iVar8) {
              iVar11 = iVar8;
            }
            if ((int)uVar6 < (int)uVar15) {
              uVar6 = uVar15;
            }
            uVar10 = 0;
            do {
              iVar7 = 0;
              if (uVar10 == (uint)(iVar9 / 2)) {
                iVar7 = -(iVar11 >> 2);
              }
              iVar7 = iVar7 + iVar4 + 2;
              if (iVar16 + 2 < iVar7) {
                piVar2 = im_00->tpixels[(int)(~(uint)uVar10 + iVar9)];
                piVar3 = im_00->tpixels[uVar10];
                lVar12 = ((long)(((ulong)uVar6 << 0x21) + 0x1000000000) >> 0x21) + 2;
                iVar14 = ((iVar16 + uVar6 * 2) - ((int)(uVar6 * 2 + 0x10) >> 1)) + 0xe;
                do {
                  iVar1 = piVar2[(long)iVar14 + -1];
                  piVar2[(long)iVar14 + -1] = piVar3[lVar12];
                  piVar3[lVar12] = iVar1;
                  lVar12 = lVar12 + 1;
                  iVar14 = iVar14 + -1;
                } while (lVar12 < iVar7);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != iVar9 / 2 + 1);
          }
          iVar9 = iVar9 * 10;
          if (iVar8 <= iVar9) {
            iVar8 = iVar9;
          }
          dst = gdImageCreateTrueColor(iVar8,iVar8);
          if (dst == (gdImagePtr)0x0) {
            local_c0 = "could not create resampled image";
          }
          else {
            iVar11 = (int)((1.0 - textRadius / radius) * (double)iVar9);
            iVar16 = (int)((textRadius / radius) * (double)iVar9);
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * (double)dst->sx * 0.25),iVar11,0,0,
                       (int)((double)dst->sx * fillPortion * 0.5),iVar16,im_00->sx / 2,im_00->sy);
            dVar17 = (double)dst->sx;
            iVar9 = im_00->sx / 2;
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * dVar17 * 0.25 + (double)(dst->sx / 2)),
                       iVar11,iVar9,0,(int)(dVar17 * fillPortion * 0.5),iVar16,iVar9,im_00->sy);
            gdImageDestroy(im_00);
            im_00 = gdImageSquareToCircle(dst,(int)radius);
            gdImageDestroy(dst);
            if (im_00 == (gdImagePtr)0x0) {
              return (char *)0x0;
            }
            uVar6 = im_00->sy;
            if ((int)uVar6 < 1) {
              local_c0 = (char *)0x0;
            }
            else {
              uVar5 = uVar6 >> 1;
              uVar15 = im_00->sx;
              uVar10 = (ulong)uVar15;
              local_c0 = (char *)0x0;
              lVar12 = 0;
              do {
                if (0 < (int)uVar10) {
                  lVar13 = 0;
                  do {
                    gdImageSetPixel(im,(cx - (int)uVar15 / 2) + (int)lVar13,
                                    (cy - uVar5) + (int)lVar12,
                                    (fgcolor & 0xffffffU | 0x7f000000) +
                                    ((((uint)im_00->tpixels[lVar12][lVar13] >> 0x11 & 0x7f) *
                                     ((uint)~fgcolor >> 0x18 & 0x7f)) / 0x7f) * -0x1000000);
                    lVar13 = lVar13 + 1;
                    uVar10 = (ulong)im_00->sx;
                  } while (lVar13 < (long)uVar10);
                  uVar6 = im_00->sy;
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < (int)uVar6);
            }
          }
        }
        gdImageDestroy(im_00);
      }
    }
  }
  return local_c0;
}

Assistant:

BGD_DECLARE(char*)
gdImageStringFTCircle (gdImagePtr im,
                       int cx,
                       int cy,
                       double radius,
                       double textRadius,
                       double fillPortion,
                       char *font,
                       double points, char *top, char *bottom, int fgcolor)
{
	char *err;
	int w;
	int brect[8];
	int sx1, sx2, sy1, sy2, sx, sy;
	int x, y;
	int fr, fg, fb, fa;
	int ox, oy;
	double prop;
	gdImagePtr im1;
	gdImagePtr im2;
	gdImagePtr im3;
	/* obtain brect so that we can size the image */
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, bottom);
	if (err) {
		return err;
	}
	sx1 = MAXX (brect) - MINX (brect) + 6;
	sy1 = MAXY (brect) - MINY (brect) + 6;
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, top);
	if (err) {
		return err;
	}
	sx2 = MAXX (brect) - MINX (brect) + 6;
	sy2 = MAXY (brect) - MINY (brect) + 6;
	/* Pad by 4 pixels to allow for slight errors
	   observed in the bounding box returned by freetype */
	if (sx1 > sx2) {
		sx = sx1 * 2 + 4;
	} else {
		sx = sx2 * 2 + 4;
	}
	if (sy1 > sy2) {
		sy = sy1;
	} else {
		sy = sy2;
	}
	im1 = gdImageCreateTrueColor (sx, sy);
	if (!im1) {
		return "could not create first image";
	}
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, ((sx / 2) - sx1) / 2, points * MAG, bottom);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* We don't know the descent, which would be needed to do this
	   with the angle parameter. Instead, implement a simple
	   flip operation ourselves. */
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, sx / 2 + ((sx / 2) - sx2) / 2, points * MAG, top);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* Flip in place is tricky, be careful not to double-swap things */
	if (sy & 1) {
		for (y = 0; (y <= (sy / 2)); y++) {
			int xlimit = sx - 2;
			if (y == (sy / 2)) {
				/* If there is a "middle" row, be careful
				   not to swap twice! */
				xlimit -= (sx / 4);
			}
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	} else {
		for (y = 0; (y < (sy / 2)); y++) {
			int xlimit = sx - 2;
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	}
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx1.png", "wb");
		gdImagePng (im1, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Resample taller; the exact proportions of the text depend on the
	   ratio of textRadius to radius, and the value of fillPortion */
	if (sx > sy * 10) {
		w = sx;
	} else {
		w = sy * 10;
	}
	im2 = gdImageCreateTrueColor (w, w);
	if (!im2) {
		gdImageDestroy (im1);
		return "could not create resampled image";
	}
	prop = textRadius / radius;
	gdImageCopyResampled (im2, im1,
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      0, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
	gdImageCopyResampled (im2, im1,
	                      (gdImageSX (im2) / 2) +
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      gdImageSX (im1) / 2, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx2.png", "wb");
		gdImagePng (im2, out);
		fclose (out);
	}
#endif /* STEP_PNGS */

	gdImageDestroy (im1);

	/* Ready to produce a circle */
	im3 = gdImageSquareToCircle (im2, radius);
	if (im3 == NULL) {
		gdImageDestroy(im2);
		return 0;
	}
	gdImageDestroy (im2);
	/* Now blend im3 with the destination. Cheat a little. The
	   source (im3) is white-on-black, so we can use the
	   red component as a basis for alpha as long as we're
	   careful to shift off the extra bit and invert
	   (alpha ranges from 0 to 127 where 0 is OPAQUE).
	   Also be careful to allow for an alpha component
	   in the fgcolor parameter itself (gug!) */
	fr = gdTrueColorGetRed (fgcolor);
	fg = gdTrueColorGetGreen (fgcolor);
	fb = gdTrueColorGetBlue (fgcolor);
	fa = gdTrueColorGetAlpha (fgcolor);
	ox = cx - (im3->sx / 2);
	oy = cy - (im3->sy / 2);
	for (y = 0; (y < im3->sy); y++) {
		for (x = 0; (x < im3->sx); x++) {
			int a = gdTrueColorGetRed (im3->tpixels[y][x]) >> 1;
			a *= (127 - fa);
			a /= 127;
			a = 127 - a;
			gdImageSetPixel (im, x + ox, y + oy,
			                 gdTrueColorAlpha (fr, fg, fb, a));
		}
	}
	gdImageDestroy (im3);
	return 0;
}